

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::UniformCase::BasicUniform::BasicUniform
          (BasicUniform *this,char *name_,DataType type_,bool isUsedInShader_,VarValue *finalValue_,
          char *rootName_,int elemNdx_,int rootSize_)

{
  char *local_78;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  char *local_30;
  char *rootName__local;
  VarValue *finalValue__local;
  bool isUsedInShader__local;
  char *pcStack_18;
  DataType type__local;
  char *name__local;
  BasicUniform *this_local;
  
  local_30 = rootName_;
  rootName__local = (char *)finalValue_;
  finalValue__local._3_1_ = isUsedInShader_;
  finalValue__local._4_4_ = type_;
  pcStack_18 = name_;
  name__local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_31);
  std::allocator<char>::~allocator(&local_31);
  this->type = finalValue__local._4_4_;
  this->isUsedInShader = (bool)(finalValue__local._3_1_ & 1);
  memcpy(&this->finalValue,rootName__local,0x44);
  if (local_30 == (char *)0x0) {
    local_78 = pcStack_18;
  }
  else {
    local_78 = local_30;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->rootName,local_78,local_45);
  std::allocator<char>::~allocator(local_45);
  this->elemNdx = elemNdx_;
  this->rootSize = rootSize_;
  return;
}

Assistant:

BasicUniform (const char* const		name_,
					  const glu::DataType	type_,
					  const bool			isUsedInShader_,
					  const VarValue&		finalValue_,
					  const char* const		rootName_	= DE_NULL,
					  const int				elemNdx_	= -1,
					  const int				rootSize_	= 1)
					  : name			(name_)
					  , type			(type_)
					  , isUsedInShader	(isUsedInShader_)
					  , finalValue		(finalValue_)
					  , rootName		(rootName_ == DE_NULL ? name_ : rootName_)
					  , elemNdx			(elemNdx_)
					  , rootSize		(rootSize_)
					 {
					 }